

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_map_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  ushort uVar1;
  int iVar2;
  JSValue JVar3;
  JSValue JVar4;
  JSValue new_target_00;
  JSValue new_target_01;
  JSValue JVar5;
  JSValue JVar6;
  JSRefCountHeader *p;
  JSValueUnion JVar7;
  uint *puVar8;
  void *pvVar9;
  JSValueUnion JVar10;
  JSValueUnion JVar11;
  JSAtom prop;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int64_t iVar17;
  JSRefCountHeader *p_4;
  ulong uVar18;
  int iVar19;
  char cVar20;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar21;
  JSValue v_02;
  JSValue JVar22;
  JSValue JVar23;
  JSValue JVar24;
  JSValue JVar25;
  JSRefCountHeader *p_2;
  JSRefCountHeader *p_6;
  BOOL done;
  undefined4 uVar26;
  undefined4 in_stack_ffffffffffffff0c;
  uint uVar27;
  BOOL *in_stack_ffffffffffffff10;
  BOOL *pdone;
  JSValueUnion local_d0;
  JSValueUnion local_c0;
  JSValueUnion local_a8 [2];
  int64_t local_98;
  int64_t local_90;
  int local_84;
  ulong local_80;
  int64_t local_78;
  JSValueUnion local_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  JSValueUnion local_58;
  int64_t local_50;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  JSValueUnion JVar12;
  
  JVar21 = js_create_from_ctor(ctx,new_target,magic + 0x1f);
  uVar16 = JVar21.tag;
  JVar7 = JVar21.u;
  if ((uVar16 & 0xffffffff) != 6) {
    puVar8 = (uint *)js_mallocz(ctx,0x30);
    if (puVar8 != (uint *)0x0) {
      *(uint **)(puVar8 + 2) = puVar8 + 2;
      *(uint **)(puVar8 + 4) = puVar8 + 2;
      *puVar8 = (uint)magic >> 1 & 1;
      if ((uint)JVar21.tag == 0xffffffff) {
        *(uint **)((long)JVar7.ptr + 0x30) = puVar8;
      }
      puVar8[10] = 1;
      pvVar9 = js_malloc(ctx,0x10);
      *(void **)(puVar8 + 8) = pvVar9;
      if (pvVar9 != (void *)0x0) {
        *(void **)pvVar9 = pvVar9;
        *(void **)((long)pvVar9 + 8) = pvVar9;
        puVar8[0xb] = 4;
        if ((argc < 1) || (iVar17 = argv->tag, ((uint)iVar17 & 0xfffffffe) == 2)) {
LAB_0012e182:
          uVar13 = (ulong)JVar7.ptr & 0xffffffff00000000;
          uVar18 = (ulong)JVar7.ptr & 0xffffffff;
          goto LAB_0012e87d;
        }
        JVar11 = (JSValueUnion)(argv->u).ptr;
        prop = 0x68;
        if ((magic & 1U) == 0) {
          prop = 0x42;
        }
        v_02 = JS_GetPropertyInternal(ctx,JVar21,prop,JVar21,0);
        JVar10 = v_02.u;
        if ((v_02.tag & 0xffffffffU) != 6) {
          if ((uint)v_02.tag == 0xffffffff) {
            uVar1 = *(ushort *)((long)JVar10.ptr + 6);
            if (uVar1 != 0xd) {
              if (uVar1 == 0x29) {
                cVar20 = *(char *)(*(long *)((long)JVar10.ptr + 0x30) + 0x20);
              }
              else {
                cVar20 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
              }
              if (cVar20 == '\0') goto LAB_0012e24d;
            }
            JVar23.tag = iVar17;
            JVar23.u = (JSValueUnion)(JSValueUnion)JVar11.ptr;
            JVar22 = JS_GetIterator(ctx,JVar23,0);
            uVar18 = JVar22.tag & 0xffffffff;
            iVar19 = (int)JVar22.tag;
            if (uVar18 != 6) {
              uVar26 = 0;
              JVar23 = JS_GetPropertyInternal(ctx,JVar22,0x6a,JVar22,0);
              uVar15 = (uint)JVar23.tag;
              local_c0 = JVar23.u;
              if (uVar15 != 6) {
                local_a8 = (JSValueUnion  [2])
                           JS_IteratorNext(ctx,JVar22,JVar23,(int)&local_84,
                                           (JSValue *)CONCAT44(in_stack_ffffffffffffff0c,uVar26),
                                           in_stack_ffffffffffffff10);
                JVar5.tag = iStack_60;
                JVar5.u.ptr = local_68.ptr;
                uVar14 = local_a8[1] & 0xffffffff;
                uVar13 = uVar18;
                JVar25 = JVar22;
                _local_68 = JVar5;
                if (uVar14 != 6) {
                  while( true ) {
                    local_80 = uVar13;
                    local_68 = JVar5.u;
                    local_90 = JVar25.tag;
                    local_70 = JVar25.u;
                    iVar19 = (int)uVar18;
                    iVar17 = JVar22.tag;
                    _local_68 = JVar5;
                    if (local_84 != 0) {
                      if ((0xfffffff4 < local_a8[1]._0_4_) &&
                         (iVar19 = *local_a8[0].ptr, *(int *)local_a8[0].ptr = iVar19 + -1,
                         iVar19 < 2)) {
                        __JS_FreeValueRT(ctx->rt,(JSValue)local_a8);
                        JVar25.tag = local_90;
                        JVar25.u.ptr = local_70.ptr;
                      }
                      local_90 = JVar25.tag;
                      local_70 = JVar25.u;
                      if ((0xfffffff4 < uVar15) &&
                         (iVar19 = *local_c0.ptr, *(int *)local_c0.ptr = iVar19 + -1, iVar19 < 2)) {
                        __JS_FreeValueRT(ctx->rt,JVar23);
                        JVar25.tag = local_90;
                        JVar25.u.float64 = local_70.float64;
                      }
                      local_90 = JVar25.tag;
                      local_70 = JVar25.u;
                      if ((0xfffffff4 < (uint)JVar22.tag) &&
                         (iVar19 = *JVar22.u.ptr, *(int *)JVar22.u.ptr = iVar19 + -1, iVar19 < 2)) {
                        __JS_FreeValueRT(ctx->rt,JVar22);
                        JVar25.tag = local_90;
                        JVar25.u.float64 = local_70.float64;
                      }
                      local_90 = JVar25.tag;
                      local_70 = JVar25.u;
                      iVar19 = *JVar10.ptr;
                      *(int *)JVar10.ptr = iVar19 + -1;
                      if (iVar19 < 2) {
                        __JS_FreeValueRT(ctx->rt,v_02);
                      }
                      goto LAB_0012e182;
                    }
                    if ((magic & 1U) == 0) break;
                    local_68.float64 = local_68.float64 & 0xffffffff00000000;
                    iStack_60 = 3;
                    uVar26 = 0;
                    uVar27 = JVar5.u._4_4_;
                    pdone = (BOOL *)0x3;
                    new_target_01.tag = 3;
                    new_target_01.u.ptr = (void *)((ulong)uVar27 << 0x20);
                    JVar25 = JS_CallInternal(ctx,v_02,JVar21,new_target_01,1,(JSValue *)local_a8,2);
                    JVar6.tag = iStack_60;
                    JVar6.u.ptr = local_68.ptr;
                    if ((int)JVar25.tag == 6) {
                      JVar4.tag = local_90;
                      JVar4.u.ptr = local_70.ptr;
                      JVar3.tag = local_90;
                      JVar3.u.ptr = local_70.ptr;
                      JVar22.tag = local_90;
                      JVar22.u.ptr = local_70.ptr;
                      if (0xfffffff4 < local_a8[1]._0_4_) {
                        iVar2 = *local_a8[0].ptr;
                        *(int *)local_a8[0].ptr = iVar2 + -1;
                        JVar22 = JVar3;
                        _local_68 = JVar6;
                        if (iVar2 < 2) {
                          __JS_FreeValueRT(ctx->rt,(JSValue)local_a8);
                          JVar22 = JVar4;
                        }
                      }
                      goto LAB_0012e7a6;
                    }
LAB_0012e4b7:
                    iVar19 = (int)uVar18;
                    _local_68 = JVar6;
                    if ((0xfffffff4 < (uint)JVar25.tag) &&
                       (iVar2 = *JVar25.u.ptr, *(int *)JVar25.u.ptr = iVar2 + -1, iVar2 < 2)) {
                      __JS_FreeValueRT(ctx->rt,JVar25);
                    }
                    if (0xfffffff4 < local_a8[1]._0_4_) {
                      iVar2 = *local_a8[0].ptr;
                      *(int *)local_a8[0].ptr = iVar2 + -1;
                      if (iVar2 < 2) {
                        __JS_FreeValueRT(ctx->rt,(JSValue)local_a8);
                      }
                    }
                    JVar22.tag = local_90;
                    JVar22.u.ptr = local_70.ptr;
                    local_a8 = (JSValueUnion  [2])
                               JS_IteratorNext(ctx,JVar22,JVar23,(int)&local_84,
                                               (JSValue *)CONCAT44(uVar27,uVar26),pdone);
                    JVar25.tag = local_90;
                    JVar25.u.ptr = local_70.ptr;
                    uVar14 = local_a8[1] & 0xffffffff;
                    uVar13 = local_80;
                    JVar5 = _local_68;
                    if (uVar14 == 6) goto LAB_0012e7a6;
                  }
                  if (uVar14 == 0xffffffff) {
                    JVar22 = JS_GetPropertyValue(ctx,(JSValue)local_a8,(JSValue)ZEXT816(0));
                    JVar11 = JVar22.u;
                    if ((uint)JVar22.tag == 6) {
                      uVar16 = 0;
                      JVar24 = (JSValue)(ZEXT816(3) << 0x40);
                    }
                    else {
                      JVar24 = JS_GetPropertyValue(ctx,(JSValue)local_a8,(JSValue)ZEXT816(1));
                      JVar12 = JVar24.u;
                      if ((int)JVar24.tag != 6) {
                        local_40 = 0;
                        uStack_38 = 3;
                        uVar26 = 0;
                        pdone = (BOOL *)0x3;
                        new_target_00.tag = 3;
                        new_target_00.u.ptr = (void *)((ulong)uStack_3c << 0x20);
                        uVar27 = uStack_3c;
                        local_78 = JVar24.tag;
                        _local_58 = JVar24;
                        _local_68 = JVar22;
                        JVar25 = JS_CallInternal(ctx,v_02,JVar21,new_target_00,2,
                                                 (JSValue *)&local_68,2);
                        if ((int)JVar25.tag != 6) {
                          if ((0xfffffff4 < (uint)JVar22.tag) &&
                             (iVar19 = *JVar11.ptr, *(int *)JVar11.ptr = iVar19 + -1, iVar19 < 2)) {
                            __JS_FreeValueRT(ctx->rt,JVar22);
                          }
                          uVar18 = local_80;
                          JVar6 = _local_68;
                          if ((0xfffffff4 < (uint)local_78) &&
                             (iVar19 = *JVar12.ptr, *(int *)JVar12.ptr = iVar19 + -1, iVar19 < 2)) {
                            v.tag = local_78;
                            v.u.ptr = JVar12.ptr;
                            __JS_FreeValueRT(ctx->rt,v);
                            uVar18 = local_80;
                            JVar6 = _local_68;
                          }
                          goto LAB_0012e4b7;
                        }
                        uVar18 = (ulong)JVar11.ptr & 0xffffffff00000000;
                        uVar16 = (ulong)JVar12.ptr & 0xffffffff00000000;
                        JVar24.tag = local_78;
                        JVar24.u.ptr = JVar12.ptr;
                        iVar19 = (int)local_80;
                        iVar17 = local_90;
                        goto LAB_0012e6f3;
                      }
                      uVar16 = (ulong)JVar12.ptr & 0xffffffff00000000;
                    }
                    uVar18 = (ulong)JVar11.ptr & 0xffffffff00000000;
                    iVar17 = local_90;
                  }
                  else {
                    uVar18 = 0;
                    JS_ThrowTypeError(ctx,"not an object");
                    JVar22 = (JSValue)(ZEXT816(3) << 0x40);
                    uVar16 = 0;
                    JVar24 = (JSValue)(ZEXT816(3) << 0x40);
                  }
LAB_0012e6f3:
                  local_98 = JVar22.tag;
                  local_d0 = JVar22.u;
                  JVar11 = JVar24.u;
                  if (0xfffffff4 < local_a8[1]._0_4_) {
                    iVar2 = *local_a8[0].ptr;
                    *(int *)local_a8[0].ptr = iVar2 + -1;
                    if (iVar2 < 2) {
                      local_78 = JVar24.tag;
                      __JS_FreeValueRT(ctx->rt,(JSValue)local_a8);
                      JVar24.tag = local_78;
                      JVar24.u.float64 = JVar11.float64;
                      iVar19 = (int)local_80;
                    }
                  }
                  if (0xfffffff4 < (uint)local_98) {
                    v_00.u.ptr = (void *)((ulong)local_d0.ptr & 0xffffffff | uVar18);
                    iVar2 = *v_00.u.ptr;
                    *(int *)v_00.u.ptr = iVar2 + -1;
                    if (iVar2 < 2) {
                      v_00.tag = local_98;
                      __JS_FreeValueRT(ctx->rt,v_00);
                      iVar19 = (int)local_80;
                    }
                  }
                  if (0xfffffff4 < (uint)JVar24.tag) {
                    v_01.u.ptr = (void *)((ulong)JVar24.u.ptr & 0xffffffff | uVar16);
                    iVar2 = *v_01.u.ptr;
                    *(int *)v_01.u.ptr = iVar2 + -1;
                    if (iVar2 < 2) {
                      v_01.tag = JVar24.tag;
                      __JS_FreeValueRT(ctx->rt,v_01);
                    }
                  }
                  JVar22.tag = iVar17;
                  JVar22.u.float64 = local_70.float64;
                }
              }
LAB_0012e7a6:
              if (iVar19 == -1) {
                JS_IteratorClose(ctx,JVar22,1);
              }
              if ((0xfffffff4 < uVar15) &&
                 (iVar19 = *local_c0.ptr, *(int *)local_c0.ptr = iVar19 + -1, iVar19 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar23);
              }
            }
            if ((0xfffffff4 < (uint)JVar22.tag) &&
               (iVar19 = *JVar22.u.ptr, *(int *)JVar22.u.ptr = iVar19 + -1, iVar19 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar22);
            }
          }
          else {
LAB_0012e24d:
            JS_ThrowTypeError(ctx,"set/add is not a function");
          }
        }
        if ((0xfffffff4 < (uint)v_02.tag) &&
           (iVar19 = *JVar10.ptr, *(int *)JVar10.ptr = iVar19 + -1, iVar19 < 2)) {
          __JS_FreeValueRT(ctx->rt,v_02);
        }
      }
    }
    if ((0xfffffff4 < (uint)JVar21.tag) &&
       (iVar19 = *JVar7.ptr, *(int *)JVar7.ptr = iVar19 + -1, iVar19 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar21);
    }
  }
  uVar18 = 0;
  uVar13 = 0;
  uVar16 = 6;
LAB_0012e87d:
  JVar21.u.ptr = (void *)(uVar18 | uVar13);
  JVar21.tag = uVar16;
  return JVar21;
}

Assistant:

static JSValue js_map_constructor(JSContext *ctx, JSValueConst new_target,
                                  int argc, JSValueConst *argv, int magic)
{
    JSMapState *s;
    JSValue obj, adder = JS_UNDEFINED, iter = JS_UNDEFINED, next_method = JS_UNDEFINED;
    JSValueConst arr;
    BOOL is_set, is_weak;

    is_set = magic & MAGIC_SET;
    is_weak = ((magic & MAGIC_WEAK) != 0);
    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_MAP + magic);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    init_list_head(&s->records);
    s->is_weak = is_weak;
    JS_SetOpaque(obj, s);
    s->hash_size = 1;
    s->hash_table = js_malloc(ctx, sizeof(s->hash_table[0]) * s->hash_size);
    if (!s->hash_table)
        goto fail;
    init_list_head(&s->hash_table[0]);
    s->record_count_threshold = 4;

    arr = JS_UNDEFINED;
    if (argc > 0)
        arr = argv[0];
    if (!JS_IsUndefined(arr) && !JS_IsNull(arr)) {
        JSValue item, ret;
        BOOL done;

        adder = JS_GetProperty(ctx, obj, is_set ? JS_ATOM_add : JS_ATOM_set);
        if (JS_IsException(adder))
            goto fail;
        if (!JS_IsFunction(ctx, adder)) {
            JS_ThrowTypeError(ctx, "set/add is not a function");
            goto fail;
        }

        iter = JS_GetIterator(ctx, arr, FALSE);
        if (JS_IsException(iter))
            goto fail;
        next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
        if (JS_IsException(next_method))
            goto fail;

        for(;;) {
            item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
            if (JS_IsException(item))
                goto fail;
            if (done) {
                JS_FreeValue(ctx, item);
                break;
            }
            if (is_set) {
                ret = JS_Call(ctx, adder, obj, 1, (JSValueConst *)&item);
                if (JS_IsException(ret)) {
                    JS_FreeValue(ctx, item);
                    goto fail;
                }
            } else {
                JSValue key, value;
                JSValueConst args[2];
                key = JS_UNDEFINED;
                value = JS_UNDEFINED;
                if (!JS_IsObject(item)) {
                    JS_ThrowTypeErrorNotAnObject(ctx);
                    goto fail1;
                }
                key = JS_GetPropertyUint32(ctx, item, 0);
                if (JS_IsException(key))
                    goto fail1;
                value = JS_GetPropertyUint32(ctx, item, 1);
                if (JS_IsException(value))
                    goto fail1;
                args[0] = key;
                args[1] = value;
                ret = JS_Call(ctx, adder, obj, 2, args);
                if (JS_IsException(ret)) {
                fail1:
                    JS_FreeValue(ctx, item);
                    JS_FreeValue(ctx, key);
                    JS_FreeValue(ctx, value);
                    goto fail;
                }
                JS_FreeValue(ctx, key);
                JS_FreeValue(ctx, value);
            }
            JS_FreeValue(ctx, ret);
            JS_FreeValue(ctx, item);
        }
        JS_FreeValue(ctx, next_method);
        JS_FreeValue(ctx, iter);
        JS_FreeValue(ctx, adder);
    }
    return obj;
 fail:
    if (JS_IsObject(iter)) {
        /* close the iterator object, preserving pending exception */
        JS_IteratorClose(ctx, iter, TRUE);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, adder);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}